

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relation.cpp
# Opt level: O2

unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>,_true> __thiscall
duckdb::Relation::Query(Relation *this,string *sql)

{
  ClientContext *query;
  bool in_DL;
  shared_ptr<duckdb::ClientContext,_true> sStack_28;
  
  shared_ptr<duckdb::ClientContextWrapper,_true>::operator->
            ((shared_ptr<duckdb::ClientContextWrapper,_true> *)((long)&sql->field_2 + 8));
  ClientContextWrapper::GetContext((ClientContextWrapper *)&sStack_28);
  query = shared_ptr<duckdb::ClientContext,_true>::operator->(&sStack_28);
  ClientContext::Query((ClientContext *)this,(string *)query,in_DL);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&sStack_28.internal.
              super___shared_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)
         (unique_ptr<duckdb::QueryResult,_std::default_delete<duckdb::QueryResult>_>)this;
}

Assistant:

unique_ptr<QueryResult> Relation::Query(const string &sql) const {
	return context->GetContext()->Query(sql, false);
}